

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

bool __thiscall
pg::DTLSolver::computeDistanceValues
          (DTLSolver *this,bitset *V,bitset *R,bitset *G,int *val,int player)

{
  uint v_00;
  unsigned_long *puVar1;
  uint64_t *puVar2;
  int *piVar3;
  bitset *pbVar4;
  bool bVar5;
  int max_prio;
  long lVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  bool local_211;
  byte local_1e1;
  byte local_199;
  undefined1 local_190 [24];
  undefined1 local_178 [4];
  int v_4;
  int local_168;
  int local_164;
  int u_2;
  int x_1;
  int iStack_158;
  bool V_changed;
  int u_1;
  int x;
  int u;
  undefined1 local_140 [16];
  undefined1 local_130 [24];
  int v_3;
  int t;
  int local_104;
  undefined1 local_100 [4];
  int v_2;
  int local_ec;
  int local_e8;
  int v_1;
  int n_candidates;
  int v;
  undefined1 local_d0 [16];
  undefined1 local_c0 [28];
  int top;
  int dist;
  int player_local;
  int *val_local;
  bitset *G_local;
  bitset *R_local;
  bitset *V_local;
  DTLSolver *this_local;
  uintqueue *local_70;
  uint local_64;
  uintqueue *local_60;
  uintqueue *local_58;
  uintqueue *local_50;
  uintqueue *local_48;
  uintqueue *local_40;
  char local_31;
  bitset *local_30;
  char local_21;
  bitset *local_20;
  uintqueue *local_18;
  uintqueue *local_10;
  
  local_c0._24_4_ = 1;
  top = player;
  _dist = val;
  val_local = (int *)G;
  G_local = R;
  R_local = V;
  V_local = (bitset *)this;
  do {
    bVar5 = bitset::any(R_local);
    if (!bVar5) {
      return false;
    }
    lVar6 = Solver::nodecount(&this->super_Solver);
    local_c0._20_4_ = (undefined4)lVar6;
    while (local_c0._20_4_ = local_c0._20_4_ - 1, -1 < (int)local_c0._20_4_) {
      bitset::operator[]((bitset *)local_c0,(size_t)R_local);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_c0);
      local_199 = 0;
      if (bVar5) {
        bitset::operator[]((bitset *)local_d0,(size_t)&this->Z);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_d0);
        local_199 = bVar5 ^ 0xff;
      }
      if ((local_199 & 1) != 0) {
        bitset::operator[]((bitset *)&n_candidates,(size_t)&this->Z);
        bitset::reference::operator=((reference *)&n_candidates,true);
        this->str[(int)local_c0._20_4_] = -1;
        local_60 = &this->Q;
        local_64 = local_c0._20_4_;
        iVar10 = (this->Q).pointer;
        (this->Q).pointer = iVar10 + 1;
        local_60->queue[iVar10] = local_c0._20_4_;
        while (pbVar4 = G_local, piVar3 = val_local, iVar10 = top, local_50 = &this->Q,
              (this->Q).pointer != 0) {
          local_40 = &this->Q;
          iVar9 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar9;
          v_00 = local_40->queue[iVar9];
          v_1 = v_00;
          iVar9 = Solver::priority(&this->super_Solver,local_c0._20_4_);
          attractVertices(this,iVar10,v_00,pbVar4,&this->Z,(bitset *)piVar3,iVar9);
          pbVar4 = G_local;
          piVar3 = val_local;
          iVar9 = top;
          iVar10 = v_1;
          max_prio = Solver::priority(&this->super_Solver,local_c0._20_4_);
          attractTangles(this,iVar9,iVar10,pbVar4,&this->Z,(bitset *)piVar3,max_prio);
        }
      }
    }
    local_e8 = 0;
    lVar6 = Solver::nodecount(&this->super_Solver);
    local_ec = (int)lVar6;
    while (local_ec = local_ec + -1, -1 < local_ec) {
      bitset::operator[]((bitset *)local_100,(size_t)R_local);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_100);
      local_1e1 = 0;
      if (bVar5) {
        bVar5 = attracts(this,top,local_ec,&this->Z,(bitset *)val_local);
        local_1e1 = bVar5 ^ 0xff;
      }
      if ((local_1e1 & 1) != 0) {
        this->Candidates[local_e8] = local_ec;
        local_e8 = local_e8 + 1;
      }
    }
    if (local_e8 == 0) {
      for (local_104 = 0; lVar6 = (long)local_104, lVar7 = Solver::nodecount(&this->super_Solver),
          lVar6 < lVar7; local_104 = local_104 + 1) {
        bitset::operator[]((bitset *)&v_3,(size_t)R_local);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)&v_3);
        if (bVar5) {
          _dist[local_104] = 0x7fffffff;
        }
      }
      local_20 = &this->Z;
      puVar1 = local_20->_bits;
      puVar2 = local_20->_bits;
      sVar8 = bitset::num_blocks(local_20);
      local_21 = '\0';
      std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar8,&local_21);
      return true;
    }
    local_130._20_4_ = 0;
    local_130._16_4_ = 0;
LAB_0021ca2c:
    lVar6 = (long)(int)local_130._16_4_;
    lVar7 = Solver::nodecount(&this->super_Solver);
    if (lVar6 <= lVar7) {
      lVar6 = (long)(int)local_130._16_4_;
      lVar7 = Solver::nodecount(&this->super_Solver);
      if (lVar6 == lVar7) {
        local_10 = &this->Q;
        if ((this->Q).pointer == 0) goto LAB_0021cdd3;
LAB_0021cc4d:
        while (local_58 = &this->Q, (this->Q).pointer != 0) {
          local_48 = &this->Q;
          iVar10 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar10;
          u_1 = local_48->queue[iVar10];
          attractVertices(this,top,u_1,G_local,&this->Z,(bitset *)val_local,local_130._20_4_);
          attractTangles(this,top,u_1,G_local,&this->Z,(bitset *)val_local,local_130._20_4_);
        }
        for (iStack_158 = 0; iStack_158 < local_e8; iStack_158 = iStack_158 + 1) {
          x_1 = this->Candidates[iStack_158];
          if (x_1 != -1) {
            iVar10 = Solver::priority(&this->super_Solver,x_1);
            if (iVar10 <= (int)local_130._20_4_) break;
            bVar5 = attracts(this,top,x_1,&this->Z,(bitset *)val_local);
            if (bVar5) {
              this->Candidates[iStack_158] = -1;
            }
          }
        }
      }
      else {
        bitset::operator[]((bitset *)local_130,(size_t)G_local);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_130);
        local_211 = true;
        if (bVar5) {
          bitset::operator[]((bitset *)local_140,(size_t)&this->Z);
          local_211 = bitset::reference::operator_cast_to_bool((reference *)local_140);
        }
        if (local_211 == false) {
          iVar10 = Solver::priority(&this->super_Solver,local_130._16_4_);
          if (((int)local_130._20_4_ < iVar10) && (local_18 = &this->Q, (this->Q).pointer == 0)) {
            local_130._20_4_ = Solver::priority(&this->super_Solver,local_130._16_4_);
          }
          iVar10 = Solver::priority(&this->super_Solver,local_130._16_4_);
          if ((int)local_130._20_4_ < iVar10) goto LAB_0021cc4d;
          bVar5 = attracts(this,top,local_130._16_4_,&this->Z,(bitset *)val_local);
          if (bVar5) {
            bitset::operator[]((bitset *)&x,(size_t)&this->Z);
            bitset::reference::operator=((reference *)&x,true);
            local_70 = &this->Q;
            this_local._4_4_ = local_130._16_4_;
            iVar10 = (this->Q).pointer;
            (this->Q).pointer = iVar10 + 1;
            local_70->queue[iVar10] = local_130._16_4_;
          }
          local_130._16_4_ = local_130._16_4_ + 1;
        }
        else {
          local_130._16_4_ = local_130._16_4_ + 1;
        }
      }
      goto LAB_0021ca2c;
    }
LAB_0021cdd3:
    u_2._3_1_ = 0;
    for (local_164 = 0; local_164 < local_e8; local_164 = local_164 + 1) {
      local_168 = this->Candidates[local_164];
      if (local_168 != -1) {
        _dist[local_168] = local_c0._24_4_;
        bitset::operator[]((bitset *)local_178,(size_t)R_local);
        bitset::reference::operator=((reference *)local_178,false);
        u_2._3_1_ = 1;
      }
    }
    local_30 = &this->Z;
    puVar1 = local_30->_bits;
    puVar2 = local_30->_bits;
    sVar8 = bitset::num_blocks(local_30);
    local_31 = '\0';
    std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar8,&local_31);
    local_c0._24_4_ = local_c0._24_4_ + 1;
    if ((u_2._3_1_ & 1) == 0) {
      for (local_190._20_4_ = 0; lVar6 = (long)(int)local_190._20_4_,
          lVar7 = Solver::nodecount(&this->super_Solver), lVar6 < lVar7;
          local_190._20_4_ = local_190._20_4_ + 1) {
        bitset::operator[]((bitset *)local_190,(size_t)R_local);
        bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_190);
        if (bVar5) {
          _dist[(int)local_190._20_4_] = 0x7fffffff;
        }
      }
      return true;
    }
  } while( true );
}

Assistant:

bool
DTLSolver::computeDistanceValues(bitset &V, bitset &R, bitset &G, int* val, const int player)
{
    int dist = 1; // start distance 1

    while (V.any()) {
        // make the partition (attract lower to higher)
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                Z[top] = true;
                str[top] = -1; // avoid valgrind warnings...
                Q.push(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(player, v, R, Z, G, priority(top));
                    attractTangles(player, v, R, Z, G, priority(top));
                }
            }
        }

        // find candidate vertices to remove from V
        int n_candidates = 0;

        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, G)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            Z.reset();
            return true;
        }

        // attract higher to lower
        int t = 0;
        for (int v=0; v<=nodecount();) {
            if (v == nodecount()) {
                if (Q.empty()) break;
            } else if (!R[v] or Z[v]) {
                v++;
                continue; // only attract vertices in <R\Z>
            } else {
                if (priority(v) > t and Q.empty()) t = priority(v);
                if (priority(v) <= t) {
                    if (attracts(player, v, Z, G)) {
                        Z[v] = true;
                        Q.push(v);
                    }
                    v++;
                    continue;
                } 
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, G, t);
                attractTangles(player, u, R, Z, G, t);
            }

            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u == -1) continue;
                if (priority(u) <= t) break; // stop checking once we are below the threshold
                if (attracts(player, u, Z, G)) Candidates[x] = -1;
            }
        }

        // remaining Candidates have no path from high to low, remove them from V

        bool V_changed = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            val[u] = dist;
            V[u] = false;
            V_changed = true;
        }

        Z.reset();
        dist++;

        if (!V_changed) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            return true;
        }
    }

    return false;
}